

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O1

void __thiscall ED::JoinAnchorPointsUsingSortedAnchors(ED *this)

{
  pointer *ppPVar1;
  uint *puVar2;
  uchar uVar3;
  uchar uVar4;
  int iVar5;
  uchar *puVar6;
  short *psVar7;
  Point *pPVar8;
  pointer pPVar9;
  bool bVar10;
  ulong uVar11;
  int count;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int *piVar16;
  void *__s;
  int *piVar17;
  Chain *chains;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  int *piVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  size_t sVar25;
  pointer pvVar26;
  int iVar27;
  long lVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  uint uVar32;
  int iVar33;
  uint *puVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  uint local_cc;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_68;
  int *local_48;
  vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
  *local_40;
  long local_38;
  
  iVar12 = this->width;
  iVar33 = this->height;
  iVar19 = iVar33 + iVar12;
  uVar24 = (long)(iVar19 * 8) << 2;
  if (iVar19 < 0) {
    uVar24 = 0xffffffffffffffff;
  }
  piVar16 = (int *)operator_new__(uVar24);
  iVar33 = iVar33 * iVar12;
  lVar36 = (long)iVar33;
  sVar25 = lVar36 * 8;
  if (iVar33 < 0) {
    sVar25 = 0xffffffffffffffff;
  }
  __s = operator_new__(sVar25);
  if (iVar33 != 0) {
    memset(__s,0,lVar36 * 8);
  }
  uVar24 = lVar36 << 4;
  uVar35 = lVar36 << 5;
  if (iVar33 < 0) {
    uVar24 = 0xffffffffffffffff;
    uVar35 = 0xffffffffffffffff;
  }
  piVar17 = (int *)operator_new__(uVar24);
  chains = (Chain *)operator_new__(uVar35);
  local_48 = sortAnchorsByGradValue1(this);
  lVar36 = (long)this->anchorNos;
  if (0 < lVar36) {
    local_40 = (vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                *)&this->segmentPoints;
    do {
      iVar19 = this->width;
      iVar12 = local_48[lVar36 + -1] / iVar19;
      iVar33 = local_48[lVar36 + -1] % iVar19;
      iVar19 = iVar19 * iVar12 + iVar33;
      local_38 = lVar36;
      if (this->edgeImg[iVar19] == 0xfe) {
        chains->parent = -1;
        chains->dir = 0;
        chains->len = 0;
        chains->children[0] = -1;
        chains->children[1] = -1;
        chains->pixels = (Point *)0x0;
        uVar3 = this->dirImg[iVar19];
        *piVar17 = iVar12;
        if (uVar3 == '\x01') {
          piVar17[1] = iVar33;
          piVar17[2] = 0;
          piVar17[3] = 4;
          piVar17[4] = iVar12;
          piVar17[5] = iVar33;
          piVar17[7] = 3;
        }
        else {
          piVar17[1] = iVar33;
          piVar17[2] = 0;
          piVar17[3] = 2;
          piVar17[4] = iVar12;
          piVar17[5] = iVar33;
          piVar17[7] = 1;
        }
        piVar17[6] = 0;
        iVar19 = 0;
        uVar35 = 1;
        uVar22 = 0;
        uVar24 = 1;
LAB_00106148:
        uVar24 = (ulong)(int)uVar24;
        uVar18 = uVar35;
LAB_0010614b:
        iVar12 = (int)uVar18;
        if (-1 < iVar12) {
          puVar2 = (uint *)(piVar17 + uVar18 * 4);
          uVar20 = piVar17[uVar18 * 4];
          uVar35 = (ulong)uVar20;
          uVar29 = piVar17[uVar18 * 4 + 1];
          lVar28 = (long)(int)uVar29;
          iVar33 = piVar17[uVar18 * 4 + 3];
          iVar5 = piVar17[uVar18 * 4 + 2];
          uVar3 = this->edgeImg[(int)(this->width * uVar20 + uVar29)];
          chains[uVar24].dir = iVar33;
          chains[uVar24].parent = iVar5;
          chains[uVar24].children[0] = -1;
          chains[uVar24].children[1] = -1;
          lVar36 = (long)(int)uVar22;
          chains[uVar24].pixels = (Point *)((long)__s + lVar36 * 8);
          *(uint *)((long)__s + lVar36 * 8 + 4) = uVar20;
          *(uint *)((long)__s + lVar36 * 8) = uVar29;
          lVar36 = (long)(int)(this->width * uVar20 + uVar29);
          uVar4 = this->dirImg[lVar36];
          local_cc = uVar22 + 1;
          uVar32 = (uint)uVar24;
          if (iVar33 == 1) {
            iVar33 = 0;
            if (uVar4 == '\x02') {
              puVar34 = (uint *)((long)__s + (long)(int)local_cc * 8 + 4);
              iVar33 = uVar29 - 1;
              lVar23 = 0;
              do {
                this->edgeImg[lVar36] = 0xff;
                iVar27 = (int)uVar35;
                uVar38 = (long)iVar27 - 1;
                lVar36 = lVar28 + (long)this->width * uVar38;
                if (this->edgeImg[lVar23 + lVar36] == 0xfe) {
                  this->edgeImg[lVar23 + lVar36] = '\0';
                }
                uVar37 = (long)iVar27 + 1;
                lVar36 = lVar28 + (long)this->width * uVar37;
                if (this->edgeImg[lVar23 + lVar36] == 0xfe) {
                  this->edgeImg[lVar23 + lVar36] = '\0';
                }
                puVar6 = this->edgeImg;
                iVar31 = this->width;
                iVar13 = (int)lVar23;
                iVar27 = iVar31 * iVar27 + iVar33 + iVar13;
                if (puVar6[iVar27] < 0xfe) {
                  iVar14 = iVar31 * (int)uVar38 + iVar33 + iVar13;
                  if (puVar6[iVar14] < 0xfe) {
                    iVar15 = iVar31 * (int)uVar37 + iVar33 + iVar13;
                    if (puVar6[iVar15] < 0xfe) {
                      psVar7 = this->gradImg;
                      if (psVar7[iVar27] < psVar7[iVar14]) {
                        if (psVar7[iVar14] <= psVar7[iVar15]) {
                          uVar38 = uVar37 & 0xffffffff;
                        }
                        uVar35 = uVar38 & 0xffffffff;
                        goto LAB_00106592;
                      }
                      if (psVar7[iVar15] <= psVar7[iVar27]) {
                        uVar37 = uVar35;
                      }
                    }
                    uVar35 = uVar37 & 0xffffffff;
                  }
                  else {
                    uVar35 = uVar38 & 0xffffffff;
                  }
                }
LAB_00106592:
                uVar20 = (uint)uVar35;
                iVar27 = iVar31 * uVar20 + iVar33 + iVar13;
                if ((puVar6[iVar27] == 0xff) || ((int)this->gradImg[iVar27] < this->gradThresh)) {
                  iVar33 = -iVar13;
                  chains[uVar24].len = 1 - iVar13;
                  chains[iVar5].children[0] = uVar32;
                  goto LAB_0010689e;
                }
                *puVar34 = uVar20;
                puVar34[-1] = iVar33 + iVar13;
                lVar36 = (long)(int)(this->width * uVar20 + iVar33 + iVar13);
                lVar23 = lVar23 + -1;
                puVar34 = puVar34 + 2;
              } while (this->dirImg[lVar36] == '\x02');
              iVar33 = (int)lVar23;
              local_cc = local_cc - iVar33;
              uVar29 = uVar29 + iVar33;
              iVar33 = -iVar33;
            }
            *puVar2 = uVar20;
            puVar2[1] = uVar29;
            puVar2[3] = 4;
            puVar2[2] = uVar32;
            piVar17[uVar18 * 4 + 4] = uVar20;
            piVar17[uVar18 * 4 + 5] = uVar29;
            piVar17[uVar18 * 4 + 7] = 3;
            piVar17[uVar18 * 4 + 6] = uVar32;
            chains[uVar24].len = iVar33;
            piVar21 = chains[iVar5].children;
            goto LAB_001069ea;
          }
          if (iVar33 == 2) {
            lVar23 = 0;
            if (uVar4 == '\x02') {
              lVar23 = 0;
LAB_00106376:
              this->edgeImg[lVar36] = 0xff;
              iVar27 = (int)uVar35;
              uVar38 = (long)iVar27 + 1;
              lVar36 = lVar28 + (long)this->width * uVar38;
              if (this->edgeImg[lVar23 + lVar36] == 0xfe) {
                this->edgeImg[lVar23 + lVar36] = '\0';
              }
              uVar37 = (long)iVar27 - 1;
              lVar36 = lVar28 + (long)this->width * uVar37;
              if (this->edgeImg[lVar23 + lVar36] == 0xfe) {
                this->edgeImg[lVar23 + lVar36] = '\0';
              }
              puVar6 = this->edgeImg;
              iVar31 = this->width;
              iVar33 = (int)lVar23;
              iVar27 = iVar31 * iVar27 + uVar29 + iVar33 + 1;
              if (puVar6[iVar27] < 0xfe) {
                iVar13 = iVar31 * (int)uVar38 + uVar29 + iVar33 + 1;
                uVar11 = uVar38;
                if ((puVar6[iVar13] < 0xfe) &&
                   (iVar14 = iVar31 * (int)uVar37 + uVar29 + iVar33 + 1, uVar11 = uVar37,
                   puVar6[iVar14] < 0xfe)) {
                  psVar7 = this->gradImg;
                  if (psVar7[iVar27] < psVar7[iVar14]) {
                    if (psVar7[iVar14] <= psVar7[iVar13]) {
                      uVar37 = uVar38 & 0xffffffff;
                    }
                    uVar35 = uVar37 & 0xffffffff;
                  }
                  else {
                    if (psVar7[iVar13] <= psVar7[iVar27]) {
                      uVar38 = uVar35;
                    }
                    uVar35 = uVar38 & 0xffffffff;
                  }
                }
                else {
                  uVar35 = uVar11 & 0xffffffff;
                }
              }
              uVar20 = (uint)uVar35;
              iVar27 = uVar29 + iVar33 + iVar31 * uVar20 + 1;
              if ((puVar6[iVar27] != 0xff) && (this->gradThresh <= (int)this->gradImg[iVar27]))
              goto code_r0x00106451;
              chains[uVar24].len = iVar33 + 1;
              chains[iVar5].children[1] = uVar32;
LAB_0010689e:
              uVar22 = local_cc + iVar33;
              goto LAB_001068fe;
            }
            goto LAB_0010691a;
          }
          iVar27 = 0;
          lVar28 = 0;
          if (iVar33 != 3) {
            if (uVar4 == '\x01') {
              lVar28 = 1;
              iVar27 = 0;
              uVar22 = local_cc;
LAB_00106652:
              this->edgeImg[lVar36] = 0xff;
              lVar36 = (long)(int)(this->width * (uVar20 + iVar27) + uVar29);
              if (this->edgeImg[lVar36 + 1] == 0xfe) {
                this->edgeImg[lVar36 + 1] = '\0';
              }
              lVar36 = (long)(int)((uVar20 + iVar27) * this->width + uVar29);
              if (this->edgeImg[lVar36 + -1] == 0xfe) {
                this->edgeImg[lVar36 + -1] = '\0';
              }
              puVar6 = this->edgeImg;
              iVar31 = uVar20 + (int)lVar28;
              iVar33 = this->width * iVar31;
              lVar36 = (long)(int)(iVar33 + uVar29);
              if (puVar6[lVar36] < 0xfe) {
                if (puVar6[lVar36 + 1] < 0xfe) {
                  if (puVar6[lVar36 + -1] < 0xfe) {
                    psVar7 = this->gradImg;
                    if (psVar7[lVar36] < psVar7[lVar36 + -1]) {
                      if (psVar7[lVar36 + 1] < psVar7[lVar36 + -1]) {
                        uVar29 = uVar29 - 1;
                      }
                      else {
                        uVar29 = uVar29 + 1;
                      }
                    }
                    else {
                      uVar29 = uVar29 + (psVar7[lVar36] < psVar7[lVar36 + 1]);
                    }
                  }
                  else {
                    uVar29 = uVar29 - 1;
                  }
                }
                else {
                  uVar29 = uVar29 + 1;
                }
              }
              iVar33 = iVar33 + uVar29;
              if ((puVar6[iVar33] != 0xff) && (this->gradThresh <= (int)this->gradImg[iVar33]))
              goto code_r0x00106741;
              chains[uVar24].len = (int)lVar28;
              chains[iVar5].children[1] = uVar32;
LAB_001068fe:
              uVar35 = (ulong)(iVar12 - 1);
              bVar10 = false;
              goto LAB_00106a02;
            }
            goto LAB_001067e7;
          }
          if (uVar4 == '\x01') {
            iVar33 = -1;
            lVar28 = 0;
            do {
              this->edgeImg[lVar36] = 0xff;
              iVar27 = (int)uVar35;
              lVar36 = (long)(int)(this->width * iVar27 + uVar29);
              if (this->edgeImg[lVar36 + -1] == 0xfe) {
                this->edgeImg[lVar36 + -1] = '\0';
              }
              lVar36 = (long)(int)(this->width * iVar27 + uVar29);
              if (this->edgeImg[lVar36 + 1] == 0xfe) {
                this->edgeImg[lVar36 + 1] = '\0';
              }
              puVar6 = this->edgeImg;
              uVar20 = iVar27 - 1;
              uVar35 = (ulong)uVar20;
              iVar27 = this->width * uVar20;
              lVar36 = (long)(int)(iVar27 + uVar29);
              if (puVar6[lVar36] < 0xfe) {
                if (puVar6[lVar36 + -1] < 0xfe) {
                  if (puVar6[lVar36 + 1] < 0xfe) {
                    psVar7 = this->gradImg;
                    if (psVar7[lVar36] < psVar7[lVar36 + -1]) {
                      if (psVar7[lVar36 + 1] < psVar7[lVar36 + -1]) {
                        uVar29 = uVar29 - 1;
                      }
                      else {
                        uVar29 = uVar29 + 1;
                      }
                    }
                    else {
                      uVar29 = uVar29 + (psVar7[lVar36] < psVar7[lVar36 + 1]);
                    }
                  }
                  else {
                    uVar29 = uVar29 + 1;
                  }
                }
                else {
                  uVar29 = uVar29 - 1;
                }
              }
              iVar27 = iVar27 + uVar29;
              if ((puVar6[iVar27] == 0xff) || ((int)this->gradImg[iVar27] < this->gradThresh)) {
                uVar22 = uVar22 - iVar33;
                chains[uVar24].len = -iVar33;
                chains[iVar5].children[0] = uVar32;
                goto LAB_001068fe;
              }
              *(uint *)((long)__s + lVar28 * 8 + (long)(int)local_cc * 8 + 4) = uVar20;
              *(uint *)((long)__s + lVar28 * 8 + (long)(int)local_cc * 8) = uVar29;
              lVar36 = (long)(int)(this->width * uVar20 + uVar29);
              iVar33 = iVar33 + -1;
              lVar28 = lVar28 + 1;
            } while (this->dirImg[lVar36] == '\x01');
            local_cc = uVar22 - iVar33;
          }
          *puVar2 = uVar20;
          puVar2[1] = uVar29;
          puVar2[3] = 2;
          puVar2[2] = uVar32;
          uVar35 = (ulong)(iVar12 + 1);
          piVar17[uVar18 * 4 + 4] = uVar20;
          piVar17[uVar18 * 4 + 5] = uVar29;
          piVar17[uVar18 * 4 + 7] = 1;
          piVar17[uVar18 * 4 + 6] = uVar32;
          chains[uVar24].len = (int)lVar28;
          piVar21 = chains[iVar5].children;
          goto LAB_001069f4;
        }
        if ((int)(uVar22 - iVar19) < this->minPathLen) {
          if (0 < (int)uVar22) {
            uVar24 = 0;
            do {
              this->edgeImg
              [(long)*(int *)((long)__s + uVar24 * 8) +
               (long)this->width * (long)*(int *)((long)__s + uVar24 * 8 + 4)] = '\0';
              this->edgeImg
              [(long)*(int *)((long)__s + uVar24 * 8) +
               (long)this->width * (long)*(int *)((long)__s + uVar24 * 8 + 4)] = '\0';
              uVar24 = uVar24 + 1;
            } while (uVar22 != uVar24);
          }
          goto LAB_001070d4;
        }
        iVar19 = LongestChain(chains,chains->children[1]);
        if (iVar19 < 1) {
          uVar35 = 0;
          goto LAB_00106c39;
        }
        iVar19 = chains->children[1];
        uVar35 = 0;
        uVar18 = 0;
        if (iVar19 != -1) {
          uVar18 = 0;
          do {
            piVar16[uVar18] = iVar19;
            iVar12 = chains[iVar19].children[0];
            if (chains[iVar19].children[0] == -1) {
              iVar12 = chains[iVar19].children[1];
            }
            iVar19 = iVar12;
            uVar18 = uVar18 + 1;
          } while (iVar19 != -1);
        }
        if (0 < (int)uVar18) {
          uVar35 = 0;
          uVar18 = uVar18 & 0xffffffff;
          do {
            iVar19 = piVar16[uVar18 - 1];
            pPVar8 = chains[iVar19].pixels;
            iVar12 = chains[iVar19].len;
            iVar33 = pPVar8[(long)iVar12 + -1].x;
            iVar5 = pPVar8[(long)iVar12 + -1].y;
            pvVar26 = (this->segmentPoints).
                      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + this->segmentNos;
            for (uVar22 = (int)uVar35 - 2; iVar27 = (int)uVar35, -1 < (int)uVar22;
                uVar22 = uVar22 - 1) {
              lVar36 = *(long *)&(pvVar26->
                                 super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                 )._M_impl.super__Vector_impl_data;
              uVar29 = iVar5 - *(int *)(lVar36 + 4 + (ulong)uVar22 * 8);
              uVar20 = -uVar29;
              if (0 < (int)uVar29) {
                uVar20 = uVar29;
              }
              uVar32 = iVar33 - *(int *)(lVar36 + (ulong)uVar22 * 8);
              uVar29 = -uVar32;
              if (0 < (int)uVar32) {
                uVar29 = uVar32;
              }
              if (1 < uVar29 || 1 < uVar20) break;
              ppPVar1 = (pointer *)
                        ((long)&(pvVar26->
                                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                )._M_impl.super__Vector_impl_data + 8);
              *ppPVar1 = *ppPVar1 + -1;
              uVar35 = (ulong)(iVar27 - 1);
            }
            if ((1 < iVar12) && (0 < iVar27)) {
              lVar36 = *(long *)&(this->segmentPoints).
                                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[this->segmentNos].
                                 super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                 ._M_impl.super__Vector_impl_data;
              uVar20 = pPVar8[(long)iVar12 + -2].y - *(int *)(lVar36 + -4 + uVar35 * 8);
              uVar22 = -uVar20;
              if (0 < (int)uVar20) {
                uVar22 = uVar20;
              }
              uVar29 = pPVar8[(long)iVar12 + -2].x - *(int *)(lVar36 + -8 + uVar35 * 8);
              uVar20 = -uVar29;
              if (0 < (int)uVar29) {
                uVar20 = uVar29;
              }
              if ((uVar22 < 2) && (uVar20 < 2)) {
                chains[iVar19].len = iVar12 + -1;
              }
            }
            iVar12 = chains[iVar19].len;
            lVar36 = (long)iVar12;
            if (0 < lVar36) {
              lVar28 = lVar36 + 1;
              lVar36 = lVar36 * 8;
              do {
                std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                          ((this->segmentPoints).
                           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + this->segmentNos,
                           (value_type *)((long)&chains[iVar19].pixels[-1].x + lVar36));
                lVar28 = lVar28 + -1;
                lVar36 = lVar36 + -8;
              } while (1 < lVar28);
              uVar35 = (ulong)(uint)(iVar27 + iVar12);
            }
            chains[iVar19].len = 0;
            bVar10 = 1 < (long)uVar18;
            uVar18 = uVar18 - 1;
          } while (bVar10);
        }
LAB_00106c39:
        iVar19 = LongestChain(chains,chains->children[0]);
        if (1 < iVar19) {
          uVar18 = 0;
          iVar19 = chains->children[0];
          while (iVar19 != -1) {
            piVar16[uVar18] = iVar19;
            iVar12 = chains[iVar19].children[0];
            if (iVar12 == -1) {
              iVar12 = chains[iVar19].children[1];
            }
            uVar18 = uVar18 + 1;
            iVar19 = iVar12;
          }
          iVar19 = *piVar16;
          chains[iVar19].pixels = chains[iVar19].pixels + 1;
          chains[iVar19].len = chains[iVar19].len + -1;
          if (0 < (int)uVar18) {
            uVar38 = 0;
            do {
              iVar19 = piVar16[uVar38];
              pPVar8 = chains[iVar19].pixels;
              iVar12 = pPVar8->x;
              iVar33 = pPVar8->y;
              pvVar26 = (this->segmentPoints).
                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + this->segmentNos;
              for (uVar22 = (int)uVar35 - 2; -1 < (int)uVar22; uVar22 = uVar22 - 1) {
                lVar36 = *(long *)&(pvVar26->
                                   super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                   )._M_impl.super__Vector_impl_data;
                uVar29 = iVar33 - *(int *)(lVar36 + 4 + (ulong)uVar22 * 8);
                uVar20 = -uVar29;
                if (0 < (int)uVar29) {
                  uVar20 = uVar29;
                }
                uVar32 = iVar12 - *(int *)(lVar36 + (ulong)uVar22 * 8);
                uVar29 = -uVar32;
                if (0 < (int)uVar32) {
                  uVar29 = uVar32;
                }
                if (1 < uVar29 || 1 < uVar20) break;
                ppPVar1 = (pointer *)
                          ((long)&(pvVar26->
                                  super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                  )._M_impl.super__Vector_impl_data + 8);
                *ppPVar1 = *ppPVar1 + -1;
                uVar35 = (ulong)((int)uVar35 - 1);
              }
              uVar22 = 0;
              if ((1 < chains[iVar19].len) && (0 < (int)uVar35)) {
                lVar36 = *(long *)&(this->segmentPoints).
                                   super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[this->segmentNos].
                                   super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                   ._M_impl.super__Vector_impl_data;
                uVar20 = pPVar8[1].y - *(int *)(lVar36 + -4 + uVar35 * 8);
                uVar22 = -uVar20;
                if (0 < (int)uVar20) {
                  uVar22 = uVar20;
                }
                uVar29 = pPVar8[1].x - *(int *)(lVar36 + -8 + uVar35 * 8);
                uVar20 = -uVar29;
                if (0 < (int)uVar29) {
                  uVar20 = uVar29;
                }
                uVar22 = (uint)(uVar20 < 2 && uVar22 < 2);
              }
              if ((int)uVar22 < chains[iVar19].len) {
                uVar37 = (ulong)(uVar22 * 8);
                do {
                  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                            ((this->segmentPoints).
                             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + this->segmentNos,
                             (value_type *)((long)&(chains[iVar19].pixels)->x + uVar37));
                  uVar35 = (ulong)((int)uVar35 + 1);
                  uVar37 = uVar37 + 8;
                  uVar22 = uVar22 + 1;
                } while ((int)uVar22 < chains[iVar19].len);
              }
              chains[iVar19].len = 0;
              uVar38 = uVar38 + 1;
            } while (uVar38 != (uVar18 & 0xffffffff));
          }
        }
        iVar19 = this->segmentNos;
        pvVar26 = (this->segmentPoints).
                  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar36 = *(long *)&pvVar26[iVar19].
                           super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                           _M_impl.super__Vector_impl_data;
        uVar20 = *(int *)(lVar36 + 0xc) - *(int *)(lVar36 + -4 + (long)(int)uVar35 * 8);
        uVar22 = -uVar20;
        if (0 < (int)uVar20) {
          uVar22 = uVar20;
        }
        uVar29 = *(int *)(lVar36 + 8) - *(int *)(lVar36 + -8 + (long)(int)uVar35 * 8);
        uVar20 = -uVar29;
        if (0 < (int)uVar29) {
          uVar20 = uVar29;
        }
        if ((uVar22 < 2) && (uVar20 < 2)) {
          pPVar9 = *(pointer *)
                    ((long)&pvVar26[iVar19].
                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                            _M_impl.super__Vector_impl_data + 8);
          if (((pointer)(lVar36 + 8) != pPVar9) &&
             (lVar28 = (long)pPVar9 - (lVar36 + 8) >> 3, 0 < lVar28)) {
            lVar28 = lVar28 + 1;
            lVar36 = lVar36 + 0xc;
            do {
              *(undefined8 *)(lVar36 + -0xc) = *(undefined8 *)(lVar36 + -4);
              lVar28 = lVar28 + -1;
              lVar36 = lVar36 + 8;
            } while (1 < lVar28);
          }
          *(pointer *)
           ((long)&pvVar26[iVar19].
                   super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                   super__Vector_impl_data + 8) = pPVar9 + -1;
        }
        this->segmentNos = iVar19 + 1;
        local_68.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
        ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
                  (local_40,&local_68);
        if (local_68.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.
                          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (2 < (long)uVar24) {
          uVar35 = 2;
          do {
            if ((1 < chains[uVar35].len) && (iVar19 = LongestChain(chains,(int)uVar35), 9 < iVar19))
            {
              uVar18 = 0;
              uVar38 = uVar35 & 0xffffffff;
              do {
                iVar19 = (int)uVar38;
                piVar16[uVar18] = iVar19;
                uVar22 = chains[iVar19].children[0];
                if (uVar22 == 0xffffffff) {
                  uVar22 = chains[iVar19].children[1];
                }
                uVar38 = (ulong)uVar22;
                uVar18 = uVar18 + 1;
              } while (uVar22 != 0xffffffff);
              if (0 < (int)uVar18) {
                uVar38 = 0;
                uVar22 = 0;
                do {
                  iVar19 = piVar16[uVar38];
                  pPVar8 = chains[iVar19].pixels;
                  iVar12 = pPVar8->x;
                  iVar33 = pPVar8->y;
                  pvVar26 = (this->segmentPoints).
                            super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + this->segmentNos;
                  for (uVar20 = uVar22 - 2; -1 < (int)uVar20; uVar20 = uVar20 - 1) {
                    lVar36 = *(long *)&(pvVar26->
                                       super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                       )._M_impl.super__Vector_impl_data;
                    uVar32 = iVar33 - *(int *)(lVar36 + 4 + (ulong)uVar20 * 8);
                    uVar29 = -uVar32;
                    if (0 < (int)uVar32) {
                      uVar29 = uVar32;
                    }
                    uVar30 = iVar12 - *(int *)(lVar36 + (ulong)uVar20 * 8);
                    uVar32 = -uVar30;
                    if (0 < (int)uVar30) {
                      uVar32 = uVar30;
                    }
                    if (1 < uVar32 || 1 < uVar29) break;
                    ppPVar1 = (pointer *)
                              ((long)&(pvVar26->
                                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                      )._M_impl.super__Vector_impl_data + 8);
                    *ppPVar1 = *ppPVar1 + -1;
                    uVar22 = uVar22 - 1;
                  }
                  uVar20 = 0;
                  if ((1 < chains[iVar19].len) && (uVar20 = 0, 0 < (int)uVar22)) {
                    lVar36 = *(long *)&(this->segmentPoints).
                                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[this->segmentNos].
                                       super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                       ._M_impl.super__Vector_impl_data;
                    uVar29 = pPVar8[1].y - *(int *)(lVar36 + -4 + (ulong)uVar22 * 8);
                    uVar20 = -uVar29;
                    if (0 < (int)uVar29) {
                      uVar20 = uVar29;
                    }
                    uVar32 = pPVar8[1].x - *(int *)(lVar36 + -8 + (ulong)uVar22 * 8);
                    uVar29 = -uVar32;
                    if (0 < (int)uVar32) {
                      uVar29 = uVar32;
                    }
                    uVar20 = (uint)(uVar29 < 2 && uVar20 < 2);
                  }
                  if ((int)uVar20 < chains[iVar19].len) {
                    uVar37 = (ulong)(uVar20 * 8);
                    do {
                      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                                ((this->segmentPoints).
                                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + this->segmentNos,
                                 (value_type *)((long)&(chains[iVar19].pixels)->x + uVar37));
                      uVar22 = uVar22 + 1;
                      uVar37 = uVar37 + 8;
                      uVar20 = uVar20 + 1;
                    } while ((int)uVar20 < chains[iVar19].len);
                  }
                  chains[iVar19].len = 0;
                  uVar38 = uVar38 + 1;
                } while (uVar38 != (uVar18 & 0xffffffff));
              }
              local_68.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_68.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_68.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
              ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
                        (local_40,&local_68);
              if (local_68.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_68.
                                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              this->segmentNos = this->segmentNos + 1;
            }
            uVar35 = uVar35 + 1;
          } while (uVar35 != (uVar24 & 0xffffffff));
        }
      }
LAB_001070d4:
      lVar36 = local_38 + -1;
    } while (1 < local_38);
  }
  pvVar26 = (this->segmentPoints).
            super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (this->segmentPoints).
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar26 + -1;
  pPVar9 = pvVar26[-1].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pPVar9 != (pointer)0x0) {
    operator_delete(pPVar9);
  }
  operator_delete__(local_48);
  operator_delete__(chains);
  operator_delete__(piVar17);
  operator_delete__(piVar16);
  operator_delete__(__s);
  return;
code_r0x00106451:
  *(uint *)((long)__s + lVar23 * 8 + (long)(int)local_cc * 8 + 4) = uVar20;
  *(uint *)((long)__s + lVar23 * 8 + (long)(int)local_cc * 8) = uVar29 + iVar33 + 1;
  lVar36 = (long)(int)(this->width * uVar20 + uVar29 + iVar33 + 1);
  lVar23 = lVar23 + 1;
  if (this->dirImg[lVar36] != '\x02') goto LAB_00106913;
  goto LAB_00106376;
LAB_00106913:
  local_cc = local_cc + (int)lVar23;
  uVar29 = uVar29 + (int)lVar23;
LAB_0010691a:
  *puVar2 = uVar20;
  puVar2[1] = uVar29;
  puVar2[3] = 4;
  puVar2[2] = uVar32;
  piVar17[uVar18 * 4 + 4] = uVar20;
  piVar17[uVar18 * 4 + 5] = uVar29;
  piVar17[uVar18 * 4 + 7] = 3;
  piVar17[uVar18 * 4 + 6] = uVar32;
  chains[uVar24].len = (int)lVar23;
  piVar21 = chains[iVar5].children + 1;
LAB_001069ea:
  uVar35 = (ulong)(iVar12 + 1);
LAB_001069f4:
  *piVar21 = uVar32;
  uVar22 = local_cc - 1;
  bVar10 = true;
LAB_00106a02:
  iVar19 = iVar19 + (uint)(uVar3 != 0xff);
  uVar24 = uVar24 + 1;
  uVar18 = uVar35;
  if (!bVar10) goto LAB_00106148;
  goto LAB_0010614b;
code_r0x00106741:
  *(int *)((long)__s + lVar28 * 8 + (long)(int)local_cc * 8 + -4) = iVar31;
  *(uint *)((long)__s + lVar28 * 8 + (long)(int)local_cc * 8 + -8) = uVar29;
  lVar36 = (long)(int)(iVar31 * this->width + uVar29);
  uVar22 = uVar22 + 1;
  lVar28 = lVar28 + 1;
  iVar27 = iVar27 + 1;
  if (this->dirImg[lVar36] != '\x01') goto code_r0x0010676f;
  goto LAB_00106652;
code_r0x0010676f:
  uVar20 = uVar20 + iVar27;
  local_cc = uVar22;
LAB_001067e7:
  *puVar2 = uVar20;
  puVar2[1] = uVar29;
  puVar2[3] = 2;
  puVar2[2] = uVar32;
  uVar35 = (ulong)(iVar12 + 1);
  piVar17[uVar18 * 4 + 4] = uVar20;
  piVar17[uVar18 * 4 + 5] = uVar29;
  piVar17[uVar18 * 4 + 7] = 1;
  piVar17[uVar18 * 4 + 6] = uVar32;
  chains[uVar24].len = iVar27;
  piVar21 = chains[iVar5].children + 1;
  goto LAB_001069f4;
}

Assistant:

void ED::JoinAnchorPointsUsingSortedAnchors()
{
	int *chainNos = new int[(width + height) * 8];

	Point *pixels = new Point[width*height];
	StackNode *stack = new StackNode[width*height];
	Chain *chains = new Chain[width*height];

	// sort the anchor points by their gradient value in decreasing order
	int *A = sortAnchorsByGradValue1();

	// Now join the anchors starting with the anchor having the greatest gradient value
	int totalPixels = 0;

	for (int k = anchorNos - 1; k >= 0; k--) {
		int pixelOffset = A[k];

		int i = pixelOffset / width;
		int j = pixelOffset % width;

		//int i = anchorPoints[k].y;
		//int j = anchorPoints[k].x;

		if (edgeImg[i*width + j] != ANCHOR_PIXEL) continue;

		chains[0].len = 0;
		chains[0].parent = -1;
		chains[0].dir = 0;
		chains[0].children[0] = chains[0].children[1] = -1;
		chains[0].pixels = NULL;


		int noChains = 1;
		int len = 0;
		int duplicatePixelCount = 0;
		int top = -1;  // top of the stack 

		if (dirImg[i*width + j] == EDGE_VERTICAL) {
			stack[++top].r = i;
			stack[top].c = j;
			stack[top].dir = ED_DOWN;
			stack[top].parent = 0;

			stack[++top].r = i;
			stack[top].c = j;
			stack[top].dir = ED_UP;
			stack[top].parent = 0;

		}
		else {
			stack[++top].r = i;
			stack[top].c = j;
			stack[top].dir = ED_RIGHT;
			stack[top].parent = 0;

			stack[++top].r = i;
			stack[top].c = j;
			stack[top].dir = ED_LEFT;
			stack[top].parent = 0;
		} //end-else

		  // While the stack is not empty
	StartOfWhile:
		while (top >= 0) {
			int r = stack[top].r;
			int c = stack[top].c;
			int dir = stack[top].dir;
			int parent = stack[top].parent;
			top--;

			if (edgeImg[r*width + c] != EDGE_PIXEL) duplicatePixelCount++;

			chains[noChains].dir = dir;   // traversal direction
			chains[noChains].parent = parent;
			chains[noChains].children[0] = chains[noChains].children[1] = -1;


			int chainLen = 0;

			chains[noChains].pixels = &pixels[len];

			pixels[len].y = r;
			pixels[len].x = c;
			len++;
			chainLen++;

			if (dir == ED_LEFT) {
				while (dirImg[r*width + c] == EDGE_HORIZONTAL) {
					edgeImg[r*width + c] = EDGE_PIXEL;

					// The edge is horizontal. Look LEFT
					//
					//   A
					//   B x 
					//   C 
					//
					// cleanup up & down pixels
					if (edgeImg[(r - 1)*width + c] == ANCHOR_PIXEL) edgeImg[(r - 1)*width + c] = 0;
					if (edgeImg[(r + 1)*width + c] == ANCHOR_PIXEL) edgeImg[(r + 1)*width + c] = 0;

					// Look if there is an edge pixel in the neighbors
					if (edgeImg[r*width + c - 1] >= ANCHOR_PIXEL) { c--; }
					else if (edgeImg[(r - 1)*width + c - 1] >= ANCHOR_PIXEL) { r--; c--; }
					else if (edgeImg[(r + 1)*width + c - 1] >= ANCHOR_PIXEL) { r++; c--; }
					else {
						// else -- follow max. pixel to the LEFT
						int A = gradImg[(r - 1)*width + c - 1];
						int B = gradImg[r*width + c - 1];
						int C = gradImg[(r + 1)*width + c - 1];

						if (A > B) {
							if (A > C) r--;
							else       r++;
						}
						else  if (C > B) r++;
						c--;
					} //end-else

					if (edgeImg[r*width + c] == EDGE_PIXEL || gradImg[r*width + c] < gradThresh) {
						if (chainLen > 0) {
							chains[noChains].len = chainLen;
							chains[parent].children[0] = noChains;
							noChains++;
						} // end-if
						goto StartOfWhile;
					} //end-else


					pixels[len].y = r;
					pixels[len].x = c;
					len++;
					chainLen++;
				} //end-while

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_DOWN;
				stack[top].parent = noChains;

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_UP;
				stack[top].parent = noChains;

				len--;
				chainLen--;

				chains[noChains].len = chainLen;
				chains[parent].children[0] = noChains;
				noChains++;

			}
			else if (dir == ED_RIGHT) {
				while (dirImg[r*width + c] == EDGE_HORIZONTAL) {
					edgeImg[r*width + c] = EDGE_PIXEL;

					// The edge is horizontal. Look RIGHT
					//
					//     A
					//   x B
					//     C
					//
					// cleanup up&down pixels
					if (edgeImg[(r + 1)*width + c] == ANCHOR_PIXEL) edgeImg[(r + 1)*width + c] = 0;
					if (edgeImg[(r - 1)*width + c] == ANCHOR_PIXEL) edgeImg[(r - 1)*width + c] = 0;

					// Look if there is an edge pixel in the neighbors
					if (edgeImg[r*width + c + 1] >= ANCHOR_PIXEL) { c++; }
					else if (edgeImg[(r + 1)*width + c + 1] >= ANCHOR_PIXEL) { r++; c++; }
					else if (edgeImg[(r - 1)*width + c + 1] >= ANCHOR_PIXEL) { r--; c++; }
					else {
						// else -- follow max. pixel to the RIGHT
						int A = gradImg[(r - 1)*width + c + 1];
						int B = gradImg[r*width + c + 1];
						int C = gradImg[(r + 1)*width + c + 1];

						if (A > B) {
							if (A > C) r--;       // A
							else       r++;       // C
						}
						else if (C > B) r++;  // C
						c++;
					} //end-else

					if (edgeImg[r*width + c] == EDGE_PIXEL || gradImg[r*width + c] < gradThresh) {
						if (chainLen > 0) {
							chains[noChains].len = chainLen;
							chains[parent].children[1] = noChains;
							noChains++;
						} // end-if
						goto StartOfWhile;
					} //end-else


					pixels[len].y = r;
					pixels[len].x = c;
					len++;
					chainLen++;
				} //end-while

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_DOWN;  // Go down
				stack[top].parent = noChains;

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_UP;   // Go up
				stack[top].parent = noChains;

				len--;
				chainLen--;

				chains[noChains].len = chainLen;
				chains[parent].children[1] = noChains;
				noChains++;

			}
			else if (dir == ED_UP) {
				while (dirImg[r*width + c] == EDGE_VERTICAL) {
					edgeImg[r*width + c] = EDGE_PIXEL;

					// The edge is vertical. Look UP
					//
					//   A B C
					//     x
					//
					// Cleanup left & right pixels
					if (edgeImg[r*width + c - 1] == ANCHOR_PIXEL) edgeImg[r*width + c - 1] = 0;
					if (edgeImg[r*width + c + 1] == ANCHOR_PIXEL) edgeImg[r*width + c + 1] = 0;

					// Look if there is an edge pixel in the neighbors
					if (edgeImg[(r - 1)*width + c] >= ANCHOR_PIXEL) { r--; }
					else if (edgeImg[(r - 1)*width + c - 1] >= ANCHOR_PIXEL) { r--; c--; }
					else if (edgeImg[(r - 1)*width + c + 1] >= ANCHOR_PIXEL) { r--; c++; }
					else {
						// else -- follow the max. pixel UP
						int A = gradImg[(r - 1)*width + c - 1];
						int B = gradImg[(r - 1)*width + c];
						int C = gradImg[(r - 1)*width + c + 1];

						if (A > B) {
							if (A > C) c--;
							else       c++;
						}
						else if (C > B) c++;
						r--;
					} //end-else

					if (edgeImg[r*width + c] == EDGE_PIXEL || gradImg[r*width + c] < gradThresh) {
						if (chainLen > 0) {
							chains[noChains].len = chainLen;
							chains[parent].children[0] = noChains;
							noChains++;
						} // end-if
						goto StartOfWhile;
					} //end-else


					pixels[len].y = r;
					pixels[len].x = c;

					len++;
					chainLen++;
				} //end-while

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_RIGHT;
				stack[top].parent = noChains;

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_LEFT;
				stack[top].parent = noChains;

				len--;
				chainLen--;

				chains[noChains].len = chainLen;
				chains[parent].children[0] = noChains;
				noChains++;

			}
			else { // dir == DOWN
				while (dirImg[r*width + c] == EDGE_VERTICAL) {
					edgeImg[r*width + c] = EDGE_PIXEL;

					// The edge is vertical
					//
					//     x
					//   A B C
					//
					// cleanup side pixels
					if (edgeImg[r*width + c + 1] == ANCHOR_PIXEL) edgeImg[r*width + c + 1] = 0;
					if (edgeImg[r*width + c - 1] == ANCHOR_PIXEL) edgeImg[r*width + c - 1] = 0;

					// Look if there is an edge pixel in the neighbors
					if (edgeImg[(r + 1)*width + c] >= ANCHOR_PIXEL) { r++; }
					else if (edgeImg[(r + 1)*width + c + 1] >= ANCHOR_PIXEL) { r++; c++; }
					else if (edgeImg[(r + 1)*width + c - 1] >= ANCHOR_PIXEL) { r++; c--; }
					else {
						// else -- follow the max. pixel DOWN
						int A = gradImg[(r + 1)*width + c - 1];
						int B = gradImg[(r + 1)*width + c];
						int C = gradImg[(r + 1)*width + c + 1];

						if (A > B) {
							if (A > C) c--;       // A
							else       c++;       // C
						}
						else if (C > B) c++;  // C
						r++;
					} //end-else

					if (edgeImg[r*width + c] == EDGE_PIXEL || gradImg[r*width + c] < gradThresh) {
						if (chainLen > 0) {
							chains[noChains].len = chainLen;
							chains[parent].children[1] = noChains;
							noChains++;
						} // end-if
						goto StartOfWhile;
					} //end-else

					pixels[len].y = r;
					pixels[len].x = c;

					len++;
					chainLen++;
				} //end-while

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_RIGHT;
				stack[top].parent = noChains;

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_LEFT;
				stack[top].parent = noChains;

				len--;
				chainLen--;

				chains[noChains].len = chainLen;
				chains[parent].children[1] = noChains;
				noChains++;
			} //end-else

		} //end-while


		if (len - duplicatePixelCount < minPathLen) {
			for (int k = 0; k<len; k++) {

				edgeImg[pixels[k].y*width + pixels[k].x] = 0;
				edgeImg[pixels[k].y*width + pixels[k].x] = 0;

			} //end-for

		}
		else {

			int noSegmentPixels = 0;

			int totalLen = LongestChain(chains, chains[0].children[1]);

			if (totalLen > 0) {
				// Retrieve the chainNos
				int count = RetrieveChainNos(chains, chains[0].children[1], chainNos);

				// Copy these pixels in the reverse order
				for (int k = count - 1; k >= 0; k--) {
					int chainNo = chainNos[k];

#if 1
					/* See if we can erase some pixels from the last chain. This is for cleanup */

					int fr = chains[chainNo].pixels[chains[chainNo].len - 1].y;
					int fc = chains[chainNo].pixels[chains[chainNo].len - 1].x;

					int index = noSegmentPixels - 2;
					while (index >= 0) {
						int dr = abs(fr - segmentPoints[segmentNos][index].y);
						int dc = abs(fc - segmentPoints[segmentNos][index].x);

						if (dr <= 1 && dc <= 1) {
							// neighbors. Erase last pixel
							segmentPoints[segmentNos].pop_back();
							noSegmentPixels--;
							index--;
						}
						else break;
					} //end-while

					if (chains[chainNo].len > 1 && noSegmentPixels > 0) {
						fr = chains[chainNo].pixels[chains[chainNo].len - 2].y;
						fc = chains[chainNo].pixels[chains[chainNo].len - 2].x;

						int dr = abs(fr - segmentPoints[segmentNos][noSegmentPixels - 1].y);
						int dc = abs(fc - segmentPoints[segmentNos][noSegmentPixels - 1].x);

						if (dr <= 1 && dc <= 1) chains[chainNo].len--;
					} //end-if
#endif

					for (int l = chains[chainNo].len - 1; l >= 0; l--) {
						segmentPoints[segmentNos].push_back(chains[chainNo].pixels[l]);
						noSegmentPixels++;
					} //end-for

					chains[chainNo].len = 0;  // Mark as copied
				} //end-for
			} //end-if

			totalLen = LongestChain(chains, chains[0].children[0]);
			if (totalLen > 1) {
				// Retrieve the chainNos
				int count = RetrieveChainNos(chains, chains[0].children[0], chainNos);

				// Copy these chains in the forward direction. Skip the first pixel of the first chain
				// due to repetition with the last pixel of the previous chain
				int lastChainNo = chainNos[0];
				chains[lastChainNo].pixels++;
				chains[lastChainNo].len--;

				for (int k = 0; k<count; k++) {
					int chainNo = chainNos[k];

#if 1
					/* See if we can erase some pixels from the last chain. This is for cleanup */
					int fr = chains[chainNo].pixels[0].y;
					int fc = chains[chainNo].pixels[0].x;

					int index = noSegmentPixels - 2;
					while (index >= 0) {
						int dr = abs(fr - segmentPoints[segmentNos][index].y);
						int dc = abs(fc - segmentPoints[segmentNos][index].x);

						if (dr <= 1 && dc <= 1) {
							// neighbors. Erase last pixel
							segmentPoints[segmentNos].pop_back();
							noSegmentPixels--;
							index--;
						}
						else break;
					} //end-while

					int startIndex = 0;
					int chainLen = chains[chainNo].len;
					if (chainLen > 1 && noSegmentPixels > 0) {
						int fr = chains[chainNo].pixels[1].y;
						int fc = chains[chainNo].pixels[1].x;

						int dr = abs(fr - segmentPoints[segmentNos][noSegmentPixels - 1].y);
						int dc = abs(fc - segmentPoints[segmentNos][noSegmentPixels - 1].x);

						if (dr <= 1 && dc <= 1) { startIndex = 1; }
					} //end-if
#endif

					  /* Start a new chain & copy pixels from the new chain */
					for (int l = startIndex; l<chains[chainNo].len; l++) {
						segmentPoints[segmentNos].push_back(chains[chainNo].pixels[l]);
						noSegmentPixels++;
					} //end-for

					chains[chainNo].len = 0;  // Mark as copied
				} //end-for
			} //end-if


			  // See if the first pixel can be cleaned up
			int fr = segmentPoints[segmentNos][1].y;
			int fc = segmentPoints[segmentNos][1].x;


			int dr = abs(fr - segmentPoints[segmentNos][noSegmentPixels - 1].y);
			int dc = abs(fc - segmentPoints[segmentNos][noSegmentPixels - 1].x);


			if (dr <= 1 && dc <= 1) {
				segmentPoints[segmentNos].erase(segmentPoints[segmentNos].begin());
				noSegmentPixels--;
			} //end-if

			segmentNos++;
			segmentPoints.push_back(vector<Point>()); // create empty vector of points for segments

													  // Copy the rest of the long chains here
			for (int k = 2; k<noChains; k++) {
				if (chains[k].len < 2) continue;

				totalLen = LongestChain(chains, k);

				if (totalLen >= 10) {

					// Retrieve the chainNos
					int count = RetrieveChainNos(chains, k, chainNos);

					// Copy the pixels
					noSegmentPixels = 0;
					for (int k = 0; k<count; k++) {
						int chainNo = chainNos[k];

#if 1					
						/* See if we can erase some pixels from the last chain. This is for cleanup */
						int fr = chains[chainNo].pixels[0].y;
						int fc = chains[chainNo].pixels[0].x;

						int index = noSegmentPixels - 2;
						while (index >= 0) {
							int dr = abs(fr - segmentPoints[segmentNos][index].y);
							int dc = abs(fc - segmentPoints[segmentNos][index].x);

							if (dr <= 1 && dc <= 1) {
								// neighbors. Erase last pixel
								segmentPoints[segmentNos].pop_back();
								noSegmentPixels--;
								index--;
							}
							else break;
						} //end-while

						int startIndex = 0;
						int chainLen = chains[chainNo].len;
						if (chainLen > 1 && noSegmentPixels > 0) {
							int fr = chains[chainNo].pixels[1].y;
							int fc = chains[chainNo].pixels[1].x;

							int dr = abs(fr - segmentPoints[segmentNos][noSegmentPixels - 1].y);
							int dc = abs(fc - segmentPoints[segmentNos][noSegmentPixels - 1].x);

							if (dr <= 1 && dc <= 1) { startIndex = 1; }
						} //end-if
#endif
						  /* Start a new chain & copy pixels from the new chain */
						for (int l = startIndex; l<chains[chainNo].len; l++) {
							segmentPoints[segmentNos].push_back(chains[chainNo].pixels[l]);
							noSegmentPixels++;
						} //end-for

						chains[chainNo].len = 0;  // Mark as copied
					} //end-for
					segmentPoints.push_back(vector<Point>()); // create empty vector of points for segments
					segmentNos++;
				} //end-if          
			} //end-for

		} //end-else

	} //end-for-outer

	// pop back last segment from vector
	// because of one preallocation in the beginning, it will always empty
	segmentPoints.pop_back();

	// Clean up
	delete[] A;
	delete[] chains;
	delete[] stack;
	delete[] chainNos;
	delete[] pixels;
}